

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5NodeCompare(Fts5Expr *pExpr,Fts5ExprNode *p1,Fts5ExprNode *p2)

{
  Fts5ExprNode *p2_local;
  Fts5ExprNode *p1_local;
  Fts5Expr *pExpr_local;
  
  if (p2->bEof == 0) {
    if (p1->bEof == 0) {
      pExpr_local._4_4_ = fts5RowidCmp(pExpr,p1->iRowid,p2->iRowid);
    }
    else {
      pExpr_local._4_4_ = 1;
    }
  }
  else {
    pExpr_local._4_4_ = -1;
  }
  return pExpr_local._4_4_;
}

Assistant:

static int fts5NodeCompare(
  Fts5Expr *pExpr,
  Fts5ExprNode *p1, 
  Fts5ExprNode *p2
){
  if( p2->bEof ) return -1;
  if( p1->bEof ) return +1;
  return fts5RowidCmp(pExpr, p1->iRowid, p2->iRowid);
}